

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

bool __thiscall
ADPlanner::Search(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace,
                 vector<int,_std::allocator<int>_> *pathIds,int *PathCost,bool bFirstSolution,
                 bool bOptimalSolution,double MaxNumofSecs)

{
  bool bVar1;
  clock_t cVar2;
  reference pvVar3;
  size_type sVar4;
  int *in_RCX;
  double *in_RSI;
  long *in_RDI;
  byte in_R8B;
  byte in_R9B;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  bool ret;
  int solcost;
  PlannerStats tempStat;
  clock_t loop_time;
  int prevexpands;
  double old_repair_time;
  CKey key;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  value_type *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined1 local_a0 [27];
  byte local_85;
  undefined4 local_84;
  double local_80;
  undefined4 local_78;
  double local_70;
  int local_68;
  clock_t local_60;
  int local_58;
  long local_48;
  CKey local_40;
  double local_30;
  byte local_22;
  byte local_21;
  int *local_20;
  double *local_10;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_30 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_20 = in_RCX;
  local_10 = in_RSI;
  CKey::CKey(&local_40);
  cVar2 = clock();
  in_RDI[0x11] = cVar2;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  local_48 = in_RDI[8];
  if ((*(byte *)(in_RDI + 9) & 1) == 0) {
    in_RDI[8] = (long)local_30;
  }
  if (((ulong)local_10[10] & 1) != 0) {
    (**(code **)(*(long *)in_RDI[1] + 200))((long *)in_RDI[1],*(byte *)(in_RDI + 0xe) & 1);
    (**(code **)(*in_RDI + 0x140))(in_RDI,local_10);
  }
  if ((*(byte *)((long)local_10 + 0x51) & 1) == 1) {
    (**(code **)(*in_RDI + 0x160))(in_RDI,local_10);
  }
  if ((local_22 & 1) == 0) {
    if ((local_21 & 1) != 0) {
      local_30 = 1000000000.0;
      in_RDI[8] = 0x41cdcd6500000000;
    }
  }
  else {
    *local_10 = 1.0;
    local_30 = 1000000000.0;
    in_RDI[8] = 0x41cdcd6500000000;
  }
  std::vector<PlannerStats,_std::allocator<PlannerStats>_>::clear
            ((vector<PlannerStats,_std::allocator<PlannerStats>_> *)0x194609);
  local_58 = 0;
  while( true ) {
    bVar1 = false;
    if ((double)in_RDI[7] <= local_10[1] && local_10[1] != (double)in_RDI[7]) {
      cVar2 = clock();
      bVar1 = false;
      if ((double)(cVar2 - in_RDI[0x11]) < local_30 * 1000000.0) {
        bVar1 = true;
        if ((local_10[1] != 1000000000.0) || (NAN(local_10[1]))) {
          cVar2 = clock();
          bVar1 = (double)(cVar2 - in_RDI[0x11]) < (double)in_RDI[8] * 1000000.0;
        }
      }
    }
    if (!bVar1) break;
    local_60 = clock();
    if (*(short *)(local_10 + 4) == 0) {
      *(short *)(local_10 + 4) = *(short *)(local_10 + 4) + 1;
    }
    if ((ABS(local_10[1] - *local_10) < 1e-07) && ((local_21 & 1) == 0)) {
      *local_10 = *local_10 - (double)in_RDI[6];
      if (*local_10 < (double)in_RDI[7]) {
        *local_10 = (double)in_RDI[7];
      }
      *(undefined1 *)(local_10 + 10) = 1;
      *(undefined1 *)((long)local_10 + 0x52) = 1;
      *(short *)(local_10 + 4) = *(short *)(local_10 + 4) + 1;
    }
    if ((*(byte *)((long)local_10 + 0x52) & 1) != 0) {
      (**(code **)(*in_RDI + 0x130))(in_RDI,local_10);
    }
    if (((ulong)local_10[10] & 1) != 0) {
      (**(code **)(*in_RDI + 0x138))(in_RDI,local_10);
    }
    in_stack_ffffffffffffff34 = (**(code **)(*in_RDI + 0x128))(SUB84(local_30,0),in_RDI,local_10);
    if (in_stack_ffffffffffffff34 == 1) {
      local_10[1] = *local_10;
    }
    if ((local_10[1] == (double)in_RDI[2]) && (!NAN(local_10[1]) && !NAN((double)in_RDI[2]))) {
      if ((*local_10 == (double)in_RDI[2]) && (!NAN(*local_10) && !NAN((double)in_RDI[2]))) {
        cVar2 = clock();
        in_RDI[3] = (long)((double)(cVar2 - local_60) / 1000000.0);
        *(int *)((long)in_RDI + 0x4c) = (int)in_RDI[0x10] - local_58;
      }
    }
    bVar1 = std::vector<PlannerStats,_std::allocator<PlannerStats>_>::empty
                      ((vector<PlannerStats,_std::allocator<PlannerStats>_> *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (bVar1) {
LAB_00194918:
      local_80 = local_10[1];
      local_68 = (int)in_RDI[0x10] - local_58;
      cVar2 = clock();
      local_70 = (double)(cVar2 - local_60) / 1000000.0;
      local_78 = *(undefined4 *)(*(long *)((long)local_10[5] + 0x38) + 0x24);
      std::vector<PlannerStats,_std::allocator<PlannerStats>_>::push_back
                ((vector<PlannerStats,_std::allocator<PlannerStats>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
    }
    else {
      in_stack_ffffffffffffff28 = (value_type *)local_10[1];
      pvVar3 = std::vector<PlannerStats,_std::allocator<PlannerStats>_>::back
                         ((vector<PlannerStats,_std::allocator<PlannerStats>_> *)
                          CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      if (((double)in_stack_ffffffffffffff28 != pvVar3->eps) ||
         (NAN((double)in_stack_ffffffffffffff28) || NAN(pvVar3->eps))) goto LAB_00194918;
    }
    local_58 = (int)in_RDI[0x10];
    if (((local_21 & 1) != 0) ||
       (*(int *)(*(long *)((long)local_10[5] + 0x38) + 0x24) == 1000000000)) break;
  }
  in_RDI[8] = local_48;
  *local_20 = *(int *)(*(long *)((long)local_10[5] + 0x38) + 0x24);
  sVar4 = std::vector<int_*,_std::allocator<int_*>_>::size
                    ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI[1] + 8));
  *(int *)((long)in_RDI + 0x84) = *(int *)((long)in_RDI + 0x84) + (int)(sVar4 << 2);
  local_84 = 1000000000;
  local_85 = 0;
  if ((*local_20 == 1000000000) ||
     ((*(double *)(in_RDI[0xf] + 8) == 1000000000.0 && (!NAN(*(double *)(in_RDI[0xf] + 8)))))) {
    local_85 = 0;
  }
  else {
    (**(code **)(*in_RDI + 0x1a0))(local_a0,in_RDI,local_10,&local_84);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    local_85 = 1;
  }
  cVar2 = clock();
  in_RDI[4] = (long)((double)(cVar2 - in_RDI[0x11]) / 1000000.0);
  in_RDI[5] = (long)local_10[1];
  CKey::~CKey(&local_40);
  return (bool)(local_85 & 1);
}

Assistant:

bool ADPlanner::Search(ADSearchStateSpace_t* pSearchStateSpace, vector<int>& pathIds, int & PathCost,
                       bool bFirstSolution, bool bOptimalSolution, double MaxNumofSecs)
{
    CKey key;
    TimeStarted = clock();
    searchexpands = 0;
    double old_repair_time = repair_time;
    if (!use_repair_time) repair_time = MaxNumofSecs;

#if DEBUG
    SBPL_FPRINTF(fDeb, "new search call (call number=%d)\n", pSearchStateSpace->callnumber);
#endif

    if (pSearchStateSpace->bReevaluatefvals) {
        // costs have changed or a new goal has been set
        environment_->EnsureHeuristicsUpdated(bforwardsearch);
        Reevaluatehvals(pSearchStateSpace);
    }


    if (pSearchStateSpace->bReinitializeSearchStateSpace == true) {
        //re-initialize state space
        ReInitializeSearchStateSpace(pSearchStateSpace);
    }

    if (bOptimalSolution) {
        pSearchStateSpace->eps = 1;
        MaxNumofSecs = INFINITECOST;
        repair_time = INFINITECOST;
    }
    else if (bFirstSolution) {
        MaxNumofSecs = INFINITECOST;
        repair_time = INFINITECOST;
    }

    //the main loop of AD*
    stats.clear();
    int prevexpands = 0;
    clock_t loop_time;
    while (pSearchStateSpace->eps_satisfied > final_epsilon &&
           (clock() - TimeStarted) < MaxNumofSecs * (double)CLOCKS_PER_SEC &&
               (pSearchStateSpace->eps_satisfied == INFINITECOST ||
               (clock() - TimeStarted) < repair_time * (double)CLOCKS_PER_SEC))
    {
        loop_time = clock();
        //it will be a new search iteration
        if (pSearchStateSpace->searchiteration == 0) pSearchStateSpace->searchiteration++;

        //decrease eps for all subsequent iterations
        if (fabs(pSearchStateSpace->eps_satisfied - pSearchStateSpace->eps) < ERR_EPS && !bFirstSolution) {
            pSearchStateSpace->eps = pSearchStateSpace->eps - dec_eps;
            if (pSearchStateSpace->eps < final_epsilon) pSearchStateSpace->eps = final_epsilon;

            pSearchStateSpace->bReevaluatefvals = true;
            pSearchStateSpace->bRebuildOpenList = true;

            pSearchStateSpace->searchiteration++;
        }

        //build a new open list by merging it with incons one
        if (pSearchStateSpace->bRebuildOpenList) BuildNewOPENList(pSearchStateSpace);

        //re-compute f-values if necessary and reorder the heap
        if (pSearchStateSpace->bReevaluatefvals) Reevaluatefvals(pSearchStateSpace);

        //improve or compute path
        if (ComputePath(pSearchStateSpace, MaxNumofSecs) == 1) {
            pSearchStateSpace->eps_satisfied = pSearchStateSpace->eps;
        }

        //print the solution cost and eps bound
        SBPL_PRINTF("eps=%f expands=%d g(sstart)=%d\n", pSearchStateSpace->eps_satisfied, searchexpands - prevexpands,
                    ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g);

        if (pSearchStateSpace->eps_satisfied == finitial_eps && pSearchStateSpace->eps == finitial_eps) {
            finitial_eps_planning_time = double(clock() - loop_time) / CLOCKS_PER_SEC;
            num_of_expands_initial_solution = searchexpands - prevexpands;
        }

        if (stats.empty() || pSearchStateSpace->eps_satisfied != stats.back().eps) {
            PlannerStats tempStat;
            tempStat.eps = pSearchStateSpace->eps_satisfied;
            tempStat.expands = searchexpands - prevexpands;
            tempStat.time = double(clock() - loop_time) / CLOCKS_PER_SEC;
            tempStat.cost = ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
            stats.push_back(tempStat);
        }

#if DEBUG
        SBPL_FPRINTF(fDeb, "eps=%f eps_sat=%f expands=%d g(sstart)=%d\n", pSearchStateSpace->eps,
                     pSearchStateSpace->eps_satisfied, searchexpands - prevexpands,
                     ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g);
#endif
        prevexpands = searchexpands;

        //if just the first solution then we are done
        if (bFirstSolution) break;

        //no solution exists
        if (((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g == INFINITECOST) break;

    }
    repair_time = old_repair_time;

#if DEBUG
    SBPL_FFLUSH(fDeb);
#endif

    PathCost = ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
    MaxMemoryCounter += environment_->StateID2IndexMapping.size() * sizeof(int);

    SBPL_PRINTF("MaxMemoryCounter = %d\n", MaxMemoryCounter);

    int solcost = INFINITECOST;
    bool ret = false;
    if (PathCost == INFINITECOST || pSearchStateSpace_->eps_satisfied == INFINITECOST) {
        SBPL_PRINTF("could not find a solution\n");
        ret = false;
    }
    else {
        SBPL_PRINTF("solution is found\n");

        pathIds = GetSearchPath(pSearchStateSpace, solcost);
        ret = true;
    }

    SBPL_PRINTF("total expands this call = %d, planning time = %.3f secs, solution cost=%d\n", searchexpands, (clock()
        - TimeStarted) / ((double)CLOCKS_PER_SEC), solcost);
    final_eps_planning_time = (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC);
    final_eps = pSearchStateSpace->eps_satisfied;

    //SBPL_FPRINTF(fStat, "%d %d\n", searchexpands, solcost);

    return ret;

}